

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O2

bool __thiscall
IntBoundCheck::SetBoundOffset(IntBoundCheck *this,int offset,bool isLoopCountBasedBound)

{
  code *pcVar1;
  IntConstType left;
  bool bVar2;
  BailOutKind BVar3;
  undefined4 *puVar4;
  IntConstOpnd *pIVar5;
  IntConstOpnd *this_00;
  IntConstOpnd *pIVar6;
  Instr *pIVar7;
  undefined7 in_register_00000011;
  IRType type;
  IntConstType local_50;
  IntConstType newSrc1Value;
  IntConstType previousOffset;
  IntConstType offsetDecrease;
  
  offsetDecrease._4_4_ = (BailOutKind)CONCAT71(in_register_00000011,isLoopCountBasedBound);
  if (this->leftValueNumber == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0x2e5,"(IsValid())","IsValid()");
    if (!bVar2) goto LAB_00515796;
    *puVar4 = 0;
  }
  newSrc1Value = 0;
  pIVar7 = this->instr;
  if (pIVar7->m_dst == (Opnd *)0x0) {
    type = TyInt64;
    pIVar5 = (IntConstOpnd *)0x0;
  }
  else {
    pIVar5 = IR::Opnd::AsIntConstOpnd(pIVar7->m_dst);
    newSrc1Value = (pIVar5->super_EncodableOpnd<long>).m_value;
    type = (pIVar5->super_Opnd).m_type;
    pIVar7 = this->instr;
  }
  left = newSrc1Value;
  bVar2 = IR::Opnd::IsIntConstOpnd(pIVar7->m_src1);
  if (bVar2) {
    this_00 = IR::Opnd::AsIntConstOpnd(this->instr->m_src1);
    bVar2 = IntConstMath::Sub(left,(this_00->super_EncodableOpnd<long>).m_value,
                              (this_00->super_Opnd).m_type,&newSrc1Value);
    if (bVar2) {
      return false;
    }
    type = (this_00->super_Opnd).m_type;
  }
  else {
    this_00 = (IntConstOpnd *)0x0;
  }
  bVar2 = IR::Opnd::IsIntConstOpnd(this->instr->m_src2);
  if (((bVar2) &&
      (pIVar6 = IR::Opnd::AsIntConstOpnd(this->instr->m_src2), pIVar6 != (IntConstOpnd *)0x0)) &&
     (bVar2 = IntConstMath::Add(newSrc1Value,(pIVar6->super_EncodableOpnd<long>).m_value,
                                (pIVar6->super_Opnd).m_type,&newSrc1Value), bVar2)) {
    return false;
  }
  if (newSrc1Value <= offset) {
    return true;
  }
  bVar2 = IntConstMath::Sub(newSrc1Value,(long)offset,type,&previousOffset);
  if (bVar2) {
    return false;
  }
  if (previousOffset < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0x309,"(offsetDecrease > 0)","offsetDecrease > 0");
    if (!bVar2) {
LAB_00515796:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (this_00 == (IntConstOpnd *)0x0) {
    if (pIVar5 == (IntConstOpnd *)0x0) {
      pIVar7 = this->instr;
      pIVar5 = IR::IntConstOpnd::New(-previousOffset,TyInt64,pIVar7->m_func,true);
      IR::Instr::SetDst(pIVar7,&pIVar5->super_Opnd);
      goto LAB_0051575c;
    }
    bVar2 = IntConstMath::Sub((pIVar5->super_EncodableOpnd<long>).m_value,previousOffset,
                              (pIVar5->super_Opnd).m_type,&local_50);
    if (bVar2) {
      return false;
    }
    this_00 = pIVar5;
    if (local_50 == 0) {
      IR::Instr::FreeDst(this->instr);
      goto LAB_0051575c;
    }
  }
  else {
    bVar2 = IntConstMath::Add((this_00->super_EncodableOpnd<long>).m_value,previousOffset,
                              (this_00->super_Opnd).m_type,&local_50);
    if (bVar2) {
      return false;
    }
  }
  IR::IntConstOpnd::SetValue(this_00,local_50);
LAB_0051575c:
  BVar3 = IR::Instr::GetBailOutKind(this->instr);
  if (BVar3 == BailOutOnFailedHoistedLoopCountBasedBoundCheck) {
    return true;
  }
  if (BVar3 == BailOutOnFailedHoistedBoundCheck) {
    if (offsetDecrease._4_1_ == '\0') {
      return true;
    }
    pIVar7 = this->instr;
    BVar3 = BailOutOnFailedHoistedLoopCountBasedBoundCheck;
  }
  else {
    pIVar7 = this->instr;
    BVar3 = offsetDecrease._4_4_ & 0xff | BailOutOnFailedHoistedBoundCheck;
  }
  IR::Instr::SetBailOutKind(pIVar7,BVar3);
  return true;
}

Assistant:

bool IntBoundCheck::SetBoundOffset(const int offset, const bool isLoopCountBasedBound) const
{
    Assert(IsValid());

    // Determine the previous offset from the instruction (src1 <= src2 + dst)
    IR::IntConstOpnd *dstOpnd = nullptr;
    IntConstType previousOffset = 0;
    IRType offsetType = TyMachReg;
    if (instr->GetDst())
    {
        dstOpnd = instr->GetDst()->AsIntConstOpnd();
        previousOffset = dstOpnd->GetValue();
        offsetType = dstOpnd->GetType();
    }

    IR::IntConstOpnd *src1Opnd = nullptr;
    if (instr->GetSrc1()->IsIntConstOpnd())
    {
        src1Opnd = instr->GetSrc1()->AsIntConstOpnd();
        if (IntConstMath::Sub(previousOffset, src1Opnd->GetValue(), src1Opnd->GetType(), &previousOffset))
            return false;
        offsetType = src1Opnd->GetType();
    }

    IR::IntConstOpnd *src2Opnd = (instr->GetSrc2()->IsIntConstOpnd() ? instr->GetSrc2()->AsIntConstOpnd() : nullptr);
    if(src2Opnd && IntConstMath::Add(previousOffset, src2Opnd->GetValue(), src2Opnd->GetType(), &previousOffset))
        return false;

    // Given a bounds check (a <= b + offset), the offset may only be decreased such that it does not invalidate the invariant
    // previously established by the check. If the offset needs to be increased, that requirement is already satisfied by the
    // previous check.
    if(offset >= previousOffset)
        return true;

    IntConstType offsetDecrease;
    if(IntConstMath::Sub(previousOffset, offset, offsetType, &offsetDecrease))
        return false;

    Assert(offsetDecrease > 0);
    if(src1Opnd)
    {
        // Prefer to increase src1, as this is an upper bound check and src1 corresponds to the index
        IntConstType newSrc1Value;
        if(IntConstMath::Add(src1Opnd->GetValue(), offsetDecrease, src1Opnd->GetType(), &newSrc1Value))
            return false;
        src1Opnd->SetValue(newSrc1Value);
    }
    else if(dstOpnd)
    {
        IntConstType newDstValue;
        if(IntConstMath::Sub(dstOpnd->GetValue(), offsetDecrease, dstOpnd->GetType(), &newDstValue))
            return false;
        if (newDstValue == 0)
            instr->FreeDst();
        else
            dstOpnd->SetValue(newDstValue);
    }
    else
        instr->SetDst(IR::IntConstOpnd::New(-offsetDecrease, TyMachReg, instr->m_func, true));

    switch(instr->GetBailOutKind())
    {
        case IR::BailOutOnFailedHoistedBoundCheck:
            if(isLoopCountBasedBound)
                instr->SetBailOutKind(IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck);
            break;

        case IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck:
            break;

        default:
            instr->SetBailOutKind(
                isLoopCountBasedBound
                    ? IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck
                    : IR::BailOutOnFailedHoistedBoundCheck);
            break;
    }
    return true;
}